

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O1

void Js::SCASerializationEngine::Serialize
               (Var root,StreamWriter *writer,Var *transferableVars,size_t cTransferableVars,
               List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sharedContentsList)

{
  ScriptContext *scriptContext;
  undefined1 local_88 [8];
  StreamSerializationCloner cloner;
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> engine;
  uint dst;
  
  scriptContext = (writer->super_ScriptContextHolder).m_scriptContext;
  cloner.m_sharedContentsrList._0_4_ = 0x1000000;
  StreamWriter::Write<unsigned_int>(writer,(uint *)&cloner.m_sharedContentsrList);
  SerializationCloner<Js::StreamWriter>::SerializationCloner
            ((SerializationCloner<Js::StreamWriter> *)local_88,scriptContext,writer,
             sharedContentsList);
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::SCAEngine
            ((SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *)
             &cloner.m_sharedContentsrList,(SerializationCloner<Js::StreamWriter> *)local_88,
             transferableVars,cTransferableVars);
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
            ((SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_> *)
             &cloner.m_sharedContentsrList,root,(uint *)((long)&engine.m_cTransferableVars + 4));
  return;
}

Assistant:

void SCASerializationEngine::Serialize(Var root, StreamWriter* writer, Var* transferableVars, size_t cTransferableVars,
        JsUtil::List<Js::SharedContents*, HeapAllocator>* sharedContentsList)
    {
        ScriptContext* scriptContext = writer->GetScriptContext();

        // Write version
        writer->Write(static_cast<uint32>(SCA_FORMAT_VERSION));

        StreamSerializationCloner cloner(scriptContext, writer, sharedContentsList);
        SCAEngine<Var, scaposition_t, StreamSerializationCloner>::Clone(root, &cloner, transferableVars, cTransferableVars);
    }